

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_net.cpp
# Opt level: O0

int libtorrent::aux::anon_unknown_4::nl_dump_request
              (int sock,uint32_t seq,nlmsghdr *request_msg,function<void_(const_nlmsghdr_*)> *on_msg
              )

{
  int iVar1;
  ssize_t sVar2;
  function<void_(const_nlmsghdr_*)> local_58;
  socklen_t local_38;
  undefined1 local_34 [4];
  socklen_t sock_addr_len;
  sockaddr_nl sock_addr;
  function<void_(const_nlmsghdr_*)> *on_msg_local;
  nlmsghdr *request_msg_local;
  uint32_t seq_local;
  int sock_local;
  
  request_msg->nlmsg_flags = 0x301;
  request_msg->nlmsg_seq = seq;
  request_msg->nlmsg_pid = 0;
  sock_addr._4_8_ = on_msg;
  sVar2 = send(sock,request_msg,(ulong)request_msg->nlmsg_len,0);
  if (sVar2 < 0) {
    seq_local = 0xffffffff;
  }
  else {
    local_38 = 0xc;
    iVar1 = getsockname(sock,(sockaddr *)local_34,&local_38);
    if (iVar1 < 0) {
      seq_local = 0xffffffff;
    }
    else {
      ::std::function<void_(const_nlmsghdr_*)>::function(&local_58,on_msg);
      seq_local = read_nl_sock(sock,seq,sock_addr_len,&local_58);
      ::std::function<void_(const_nlmsghdr_*)>::~function(&local_58);
    }
  }
  return seq_local;
}

Assistant:

int nl_dump_request(int const sock, std::uint32_t const seq
		, nlmsghdr* const request_msg, std::function<void(nlmsghdr const*)> on_msg)
	{
		request_msg->nlmsg_flags = NLM_F_DUMP | NLM_F_REQUEST;
		request_msg->nlmsg_seq = seq;
		// in theory nlmsg_pid should be set to the netlink port ID (NOT the process ID)
		// of the sender, but the kernel ignores this field so it is typically set to
		// zero
		request_msg->nlmsg_pid = 0;

		if (::send(sock, request_msg, request_msg->nlmsg_len, 0) < 0)
			return -1;

		// get the socket's port ID so that we can verify it in the response
		sockaddr_nl sock_addr;
		socklen_t sock_addr_len = sizeof(sock_addr);
		if (::getsockname(sock, reinterpret_cast<sockaddr*>(&sock_addr), &sock_addr_len) < 0)
			return -1;

		return read_nl_sock(sock, seq, sock_addr.nl_pid, std::move(on_msg));
	}